

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.h
# Opt level: O3

void __thiscall
slang::ast::CaseAssertionExpr::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (CaseAssertionExpr *this,MonitorVisitor *visitor)

{
  pointer pIVar1;
  size_type sVar2;
  pointer ppEVar3;
  Expression *this_00;
  AssertionExpr *this_01;
  long lVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range4;
  pointer pIVar5;
  
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
            (this->expr,this->expr,visitor);
  sVar2 = (this->items).size_;
  if (sVar2 != 0) {
    pIVar5 = (this->items).data_;
    pIVar1 = pIVar5 + sVar2;
    do {
      sVar2 = (pIVar5->expressions).size_;
      if (sVar2 != 0) {
        ppEVar3 = (pIVar5->expressions).data_;
        lVar4 = 0;
        do {
          this_00 = *(Expression **)((long)ppEVar3 + lVar4);
          Expression::
          visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                    (this_00,this_00,visitor);
          lVar4 = lVar4 + 8;
        } while (sVar2 << 3 != lVar4);
      }
      this_01 = (pIVar5->body).ptr;
      if (this_01 == (AssertionExpr *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::AssertionExpr *>::get() const [T = const slang::ast::AssertionExpr *]"
                  );
      }
      AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this_01,visitor);
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != pIVar1);
  }
  if (this->defaultCase != (AssertionExpr *)0x0) {
    AssertionExpr::visit<slang::ast::builtins::MonitorVisitor>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto e : item.expressions)
                e->visit(visitor);
            item.body->visit(visitor);
        }

        if (defaultCase)
            defaultCase->visit(visitor);
    }